

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O3

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int,std::vector<int,std::allocator<int>>>
               (AVisitor<hiberlite::KillChildren> *ar,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *m,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  body;
  string local_110;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_f0;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_a0;
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_> local_50;
  
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"items","");
  local_50.xx.first = 0;
  local_50.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_50.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_50.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50.it._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50.ct = m;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  ::collection_nvp(&local_a0,&local_110,&local_50);
  if (local_50.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  paVar1 = &local_f0.name.field_2;
  local_f0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_a0.name._M_dataplus._M_p,
             local_a0.name._M_dataplus._M_p + local_a0.name._M_string_length);
  local_f0.stream.ct = local_a0.stream.ct;
  local_f0.stream.it._M_node = local_a0.stream.it._M_node;
  local_f0.stream.xx.first = local_a0.stream.xx.first;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_f0.stream.xx.second,&local_a0.stream.xx.second);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_f0);
  if (local_f0.stream.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.stream.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.name._M_dataplus._M_p);
  }
  if (local_a0.stream.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.stream.xx.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::map<Key,Data>& m, const unsigned int)
{
	typedef std::pair<Key,Data> ElType;
	collection_nvp<ElType,stl_map_adapter<Key,Data> >
			body( "items", stl_map_adapter<Key,Data>(m) );
	ar & body;
}